

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O3

Template * __thiscall
ctemplate::TemplateCache::GetTemplate(TemplateCache *this,TemplateString *filename,Strip strip)

{
  int iVar1;
  Mutex *pMVar2;
  mapped_type *pmVar3;
  Template *pTVar4;
  RefcountedTemplate *refcounted_tpl;
  TemplateCacheKey cache_key;
  RefcountedTemplate *local_38;
  TemplateCacheKey local_30;
  
  local_30.first = TemplateString::GetGlobalId(filename);
  pMVar2 = this->mutex_;
  iVar1 = pMVar2->mutex_;
  pMVar2->mutex_ = pMVar2->mutex_ + -1;
  local_30.second = strip;
  if (iVar1 != 0) {
    __assert_fail("--mutex_ == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/mutex.h"
                  ,0xea,"void ctemplate::Mutex::Lock()");
  }
  local_38 = GetTemplateLocked(this,filename,strip,&local_30);
  if (local_38 == (RefcountedTemplate *)0x0) {
    pTVar4 = (Template *)0x0;
  }
  else {
    RefcountedTemplate::IncRef(local_38);
    pmVar3 = std::__detail::
             _Map_base<ctemplate::TemplateCache::RefcountedTemplate_*,_std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>,_std::allocator<std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<ctemplate::TemplateCache::RefcountedTemplate_*>,_ctemplate::TemplateCache::RefTplPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<ctemplate::TemplateCache::RefcountedTemplate_*,_std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>,_std::allocator<std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<ctemplate::TemplateCache::RefcountedTemplate_*>,_ctemplate::TemplateCache::RefTplPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this->get_template_calls_,&local_38);
    *pmVar3 = *pmVar3 + 1;
    pTVar4 = local_38->ptr_;
  }
  pMVar2->mutex_ = pMVar2->mutex_ + 1;
  if (pMVar2->mutex_ == 0) {
    return pTVar4;
  }
  __assert_fail("mutex_++ == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/mutex.h"
                ,0xeb,"void ctemplate::Mutex::Unlock()");
}

Assistant:

const Template *TemplateCache::GetTemplate(const TemplateString& filename,
                                           Strip strip) {
  // No need to have the cache-mutex acquired for this step
  TemplateCacheKey cache_key = TemplateCacheKey(filename.GetGlobalId(), strip);
  CachedTemplate retval;
  WriterMutexLock ml(mutex_);
  RefcountedTemplate* refcounted_tpl =
      GetTemplateLocked(filename, strip, cache_key);
  if (!refcounted_tpl)
    return NULL;

  refcounted_tpl->IncRef();   // DecRef() is in DoneWithGetTemplatePtrs()
  (*get_template_calls_)[refcounted_tpl]++;   // set up for DoneWith...()
  return refcounted_tpl->tpl();
}